

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

Gia_Man_t * Cec_ManLSCorrespondence(Gia_Man_t *pAig,Cec_ParCor_t *pPars)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint *pInitState;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  Vec_Ptr_t *pVVar8;
  void *pvVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  
  if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
    free(pAig->pReprs);
    pAig->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (pAig->pNexts != (int *)0x0) {
    free(pAig->pNexts);
    pAig->pNexts = (int *)0x0;
  }
  if (pPars->nPrefix == 0) {
    iVar10 = Cec_ManLSCorrespondenceClasses(pAig,pPars);
    if (iVar10 == 0) {
      pGVar6 = Gia_ManDup(pAig);
      return pGVar6;
    }
  }
  else {
    pInitState = Cec_ManComputeInitState(pAig,pPars->nPrefix);
    pGVar6 = Gia_ManDupFlip(pAig,(int *)pInitState);
    free(pInitState);
    Cec_ManLSCorrespondenceClasses(pGVar6,pPars);
    piVar1 = pGVar6->pNexts;
    pAig->pReprs = pGVar6->pReprs;
    pAig->pNexts = piVar1;
    pGVar6->pReprs = (Gia_Rpr_t *)0x0;
    pGVar6->pNexts = (int *)0x0;
    pPars->fUseCSat = 0;
    iVar10 = 1000;
    if (1000 < pPars->nBTLimit) {
      iVar10 = pPars->nBTLimit;
    }
    pPars->nBTLimit = iVar10;
    Cec_ManLSCorrespondenceBmc(pAig,pPars,pPars->nPrefix);
    Gia_ManStop(pGVar6);
  }
  if (pPars->fMakeChoices == 0) {
    pGVar7 = Gia_ManCorrReduce(pAig);
    pGVar6 = Gia_ManSeqCleanup(pGVar7);
    Gia_ManStop(pGVar7);
    iVar10 = (int)pGVar7;
  }
  else {
    pGVar7 = pAig;
    pGVar6 = Gia_ManEquivToChoices(pAig,1);
    iVar10 = (int)pGVar7;
  }
  if (pPars->fVerbose != 0) {
    uVar2 = Gia_ManAndNum(pAig);
    pGVar7 = pGVar6;
    uVar3 = Gia_ManAndNum(pGVar6);
    iVar10 = (int)pGVar7;
    dVar12 = 1.0;
    dVar11 = 1.0;
    if (uVar2 != 0) {
      dVar11 = (double)(int)uVar2;
    }
    iVar4 = pAig->nRegs;
    if (iVar4 != 0) {
      dVar12 = (double)iVar4;
    }
    Abc_Print(iVar10,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(int)(uVar2 - uVar3) * 100.0) / dVar11,
              ((double)(iVar4 - pGVar6->nRegs) * 100.0) / dVar12,(ulong)uVar2,(ulong)uVar3);
  }
  uVar2 = pPars->nPrefix;
  if (uVar2 != 0) {
    iVar4 = Gia_ManAndNum(pGVar6);
    pGVar7 = pAig;
    iVar5 = Gia_ManAndNum(pAig);
    iVar10 = (int)pGVar7;
    if ((iVar4 < iVar5) || (pGVar6->nRegs < pAig->nRegs)) {
      Abc_Print(iVar10,"The reduced AIG was produced using %d-th invariants and will not verify.\n",
                (ulong)uVar2);
    }
  }
  if (pPars->fVerboseFlops != 0) {
    if (pAig->vNamesIn == (Vec_Ptr_t *)0x0) {
      Abc_Print(iVar10,"Flop output names are not available. Use command \"&get -n\".\n");
    }
    else {
      Cec_ManPrintFlopEquivs(pAig);
    }
  }
  if (pAig->vNamesIn != (Vec_Ptr_t *)0x0) {
    pVVar8 = Vec_PtrDupStr(pAig->vNamesIn);
    pGVar6->vNamesIn = pVVar8;
    for (iVar10 = pGVar6->vCis->nSize; iVar10 < pVVar8->nSize; iVar10 = iVar10 + 1) {
      pvVar9 = Vec_PtrEntry(pVVar8,iVar10);
      free(pvVar9);
      pVVar8 = pGVar6->vNamesIn;
    }
    Vec_PtrShrink(pVVar8,pGVar6->vCis->nSize);
  }
  if (pAig->vNamesOut != (Vec_Ptr_t *)0x0) {
    pVVar8 = Vec_PtrDupStr(pAig->vNamesOut);
    pGVar6->vNamesOut = pVVar8;
    for (iVar10 = pGVar6->vCos->nSize; iVar10 < pVVar8->nSize; iVar10 = iVar10 + 1) {
      pvVar9 = Vec_PtrEntry(pVVar8,iVar10);
      free(pvVar9);
      pVVar8 = pGVar6->vNamesOut;
    }
    Vec_PtrShrink(pVVar8,pGVar6->vCos->nSize);
  }
  return pGVar6;
}

Assistant:

Gia_Man_t * Cec_ManLSCorrespondence( Gia_Man_t * pAig, Cec_ParCor_t * pPars )
{  
    Gia_Man_t * pNew, * pTemp;
    unsigned * pInitState;
    int RetValue;
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    if ( pPars->nPrefix == 0 )
    {
        RetValue = Cec_ManLSCorrespondenceClasses( pAig, pPars );
        if ( RetValue == 0 )
            return Gia_ManDup( pAig );
    }
    else
    {
        // compute the cycles AIG
        pInitState = Cec_ManComputeInitState( pAig, pPars->nPrefix );
        pTemp = Gia_ManDupFlip( pAig, (int *)pInitState );
        ABC_FREE( pInitState );
        // compute classes of this AIG
        RetValue = Cec_ManLSCorrespondenceClasses( pTemp, pPars );
        // transfer the class info
        pAig->pReprs = pTemp->pReprs; pTemp->pReprs = NULL;
        pAig->pNexts = pTemp->pNexts; pTemp->pNexts = NULL;
        // perform additional BMC
        pPars->fUseCSat = 0;
        pPars->nBTLimit = Abc_MaxInt( pPars->nBTLimit, 1000 );
        Cec_ManLSCorrespondenceBmc( pAig, pPars, pPars->nPrefix );
/*
        // transfer the class info back
        pTemp->pReprs = pAig->pReprs; pAig->pReprs = NULL;
        pTemp->pNexts = pAig->pNexts; pAig->pNexts = NULL;
        // continue refining
        RetValue = Cec_ManLSCorrespondenceClasses( pTemp, pPars );
        // transfer the class info
        pAig->pReprs = pTemp->pReprs; pTemp->pReprs = NULL;
        pAig->pNexts = pTemp->pNexts; pTemp->pNexts = NULL;
*/
        Gia_ManStop( pTemp );
    }
    // derive reduced AIG
    if ( pPars->fMakeChoices )
    {
        pNew = Gia_ManEquivToChoices( pAig, 1 );
//        Gia_ManHasChoices_very_old( pNew );
    }
    else
    {
//        Gia_ManEquivImprove( pAig );
        pNew = Gia_ManCorrReduce( pAig );
        pNew = Gia_ManSeqCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
        //Gia_AigerWrite( pNew, "reduced.aig", 0, 0, 0 );
    }
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pNew), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(pNew))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(pNew), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(pNew))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
    }
    if ( pPars->nPrefix && (Gia_ManAndNum(pNew) < Gia_ManAndNum(pAig) || Gia_ManRegNum(pNew) < Gia_ManRegNum(pAig)) )
        Abc_Print( 1, "The reduced AIG was produced using %d-th invariants and will not verify.\n", pPars->nPrefix );
    // print verbose info about equivalences
    if ( pPars->fVerboseFlops )
    {
        if ( pAig->vNamesIn == NULL )
            Abc_Print( 1, "Flop output names are not available. Use command \"&get -n\".\n" );
        else
            Cec_ManPrintFlopEquivs( pAig );
    }
    // copy names if present
    if ( pAig->vNamesIn )
    {
        char * pName; int i;
        pNew->vNamesIn = Vec_PtrDupStr( pAig->vNamesIn );
        Vec_PtrForEachEntryStart( char *, pNew->vNamesIn, pName, i, Gia_ManCiNum(pNew) )
            ABC_FREE( pName );
        Vec_PtrShrink( pNew->vNamesIn, Gia_ManCiNum(pNew) );
    }
    if ( pAig->vNamesOut )
    {
        char * pName; int i;
        pNew->vNamesOut = Vec_PtrDupStr( pAig->vNamesOut );
        Vec_PtrForEachEntryStart( char *, pNew->vNamesOut, pName, i, Gia_ManCoNum(pNew) )
            ABC_FREE( pName );
        Vec_PtrShrink( pNew->vNamesOut, Gia_ManCoNum(pNew) );
    }
    return pNew;
}